

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O1

SelectionSet * __thiscall
OpenMD::IndexFinder::find(SelectionSet *__return_storage_ptr__,IndexFinder *this,int molIndex)

{
  int worldRank;
  int local_3c;
  vector<int,_std::allocator<int>_> local_38;
  
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_3c);
  if ((this->info_->molToProcMap_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[molIndex] == local_3c) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::vector
              (&__return_storage_ptr__->bitsets_,
               &(this->selectionSets_).
                super__Vector_base<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>.
                _M_impl.super__Vector_impl_data._M_start[molIndex].bitsets_);
  }
  else {
    std::vector<int,_std::allocator<int>_>::vector(&local_38,&this->nObjects_);
    SelectionSet::SelectionSet(__return_storage_ptr__,&local_38);
    if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionSet IndexFinder::find(int molIndex) {
#ifdef IS_MPI
    int proc;
    int worldRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &worldRank);
    proc = info_->getMolToProc(molIndex);

    if (proc == worldRank) {
#endif
      return selectionSets_[molIndex];
#ifdef IS_MPI
    } else {
      return SelectionSet(nObjects_);
    }
#endif
  }